

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_file.c
# Opt level: O1

void close_report(FILE *out)

{
  int nwrn;
  uint nerr;
  int numwrns;
  int numerrs;
  undefined8 local_28;
  
  local_28 = 0;
  if (prstat != 0) {
    hdus_summary(out);
  }
  total_errors((int *)((long)&local_28 + 4),(int *)&local_28);
  nwrn = (int)local_28;
  total_warn = (int)local_28;
  nerr = local_28._4_4_;
  total_err = local_28._4_4_;
  sprintf(comm,"**** Verification found %d warning(s) and %d error(s). ****",local_28 & 0xffffffff,
          (ulong)local_28._4_4_);
  wrtout(out,comm);
  update_parfile(nerr,nwrn);
  destroy_hduname();
  return;
}

Assistant:

void close_report(FILE *out              /* output file */ )
{
    int numerrs = 0;                    /* number of the errors         */
    int numwrns = 0;                    /* number of the warnings       */

    /* print out a summary of all the hdus */
    if(prstat)hdus_summary(out);
    total_errors (&numerrs, &numwrns);

    total_warn = numwrns;
    total_err  = numerrs;

    /* get the total number of errors and warnnings */
    sprintf(comm,"**** Verification found %d warning(s) and %d error(s). ****",
              numwrns, numerrs);
    wrtout(out,comm);

    update_parfile(numerrs,numwrns);
    /* destroy the hdu name */
    destroy_hduname();
    return ;
}